

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall CUI::ClipEnable(CUI *this,CUIRect *pRect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  CUIRect *pCVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (this->m_NumClips == 0) {
    fVar8 = pRect->y;
    fVar9 = pRect->w;
    fVar10 = pRect->h;
    this->m_aClips[0].x = pRect->x;
    this->m_aClips[0].y = fVar8;
    this->m_aClips[0].w = fVar9;
    this->m_aClips[0].h = fVar10;
    uVar12 = 1;
  }
  else {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                   ,0xb0,(uint)(this->m_NumClips < 0x10),"max clip nesting depth exceeded");
    pCVar11 = ClipArea(this);
    uVar12 = this->m_NumClips + 1;
    uVar4._0_4_ = pRect->x;
    uVar4._4_4_ = pRect->y;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar4;
    uVar1 = pRect->w;
    uVar5 = pRect->h;
    auVar15._0_4_ = (float)uVar1 + (float)(undefined4)uVar4;
    auVar15._4_4_ = (float)uVar5 + (float)uVar4._4_4_;
    auVar15._8_8_ = 0;
    uVar2 = pCVar11->x;
    uVar6 = pCVar11->y;
    auVar14._4_4_ = uVar6;
    auVar14._0_4_ = uVar2;
    uVar3 = pCVar11->w;
    uVar7 = pCVar11->h;
    auVar16._4_4_ = (float)uVar7 + (float)uVar6;
    auVar16._0_4_ = (float)uVar3 + (float)uVar2;
    auVar16._8_8_ = 0;
    auVar16 = minps(auVar15,auVar16);
    auVar14._8_8_ = 0;
    auVar14 = maxps(auVar13,auVar14);
    pCVar11 = this->m_aClips + this->m_NumClips;
    pCVar11->x = (float)(int)auVar14._0_8_;
    pCVar11->y = (float)(int)((ulong)auVar14._0_8_ >> 0x20);
    pCVar11->w = auVar16._0_4_ - (float)(undefined4)uVar4;
    pCVar11->h = auVar16._4_4_ - (float)uVar4._4_4_;
  }
  this->m_NumClips = uVar12;
  UpdateClipping(this);
  return;
}

Assistant:

void CUI::ClipEnable(const CUIRect *pRect)
{
	if(IsClipped())
	{
		dbg_assert(m_NumClips < MAX_CLIP_NESTING_DEPTH, "max clip nesting depth exceeded");
		const CUIRect *pOldRect = ClipArea();
		CUIRect Intersection;
		Intersection.x = maximum(pRect->x, pOldRect->x);
		Intersection.y = maximum(pRect->y, pOldRect->y);
		Intersection.w = minimum(pRect->x+pRect->w, pOldRect->x+pOldRect->w) - pRect->x;
		Intersection.h = minimum(pRect->y+pRect->h, pOldRect->y+pOldRect->h) - pRect->y;
		m_aClips[m_NumClips] = Intersection;
	}
	else
	{
		m_aClips[m_NumClips] = *pRect;
	}
	m_NumClips++;
	UpdateClipping();
}